

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_bounds.h
# Opt level: O0

PreprocessInfoStd * __thiscall
mp::
BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ComputeBoundsAndType<mp::QuadAndLinTerms>
          (BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgebraicExpression<mp::QuadAndLinTerms> *ae)

{
  bool bVar1;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_RDX;
  double in_RSI;
  PreprocessInfoStd *in_RDI;
  double dVar2;
  PreprocessInfoStd *result;
  
  AlgebraicExpression<mp::QuadAndLinTerms>::GetBody(in_RDX);
  ComputeBoundsAndType(this,&ae->super_QuadAndLinTerms);
  dVar2 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(in_RDX);
  in_RDI->lb_ = dVar2 + in_RDI->lb_;
  dVar2 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(in_RDX);
  in_RDI->ub_ = dVar2 + in_RDI->ub_;
  AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(in_RDX);
  bVar1 = is_integer<double>(in_RSI);
  if (!bVar1) {
    in_RDI->type_ = CONTINUOUS;
  }
  return in_RDI;
}

Assistant:

PreprocessInfoStd ComputeBoundsAndType(
      const AlgebraicExpression<Body>& ae) const {
    PreprocessInfoStd result
        = ComputeBoundsAndType(ae.GetBody());
    result.lb_ += ae.constant_term();
    result.ub_ += ae.constant_term();
    if (!is_integer(ae.constant_term()))
      result.type_ = var::CONTINUOUS;
    return result;
  }